

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jccolor.c
# Opt level: O3

void rgb_ycc_convert(j_compress_ptr cinfo,JSAMPARRAY input_buf,JSAMPIMAGE output_buf,
                    JDIMENSION output_row,int num_rows)

{
  uint uVar1;
  _func_void_j_compress_ptr *p_Var2;
  JSAMPROW pJVar3;
  JSAMPROW pJVar4;
  JSAMPROW pJVar5;
  bool bVar6;
  byte *pbVar7;
  ulong uVar8;
  ulong uVar9;
  ulong uVar10;
  ulong uVar11;
  
  if (0 < num_rows) {
    p_Var2 = cinfo->cconvert[1].start_pass;
    uVar1 = cinfo->image_width;
    do {
      if ((ulong)uVar1 != 0) {
        pJVar3 = (*output_buf)[output_row];
        pJVar4 = output_buf[1][output_row];
        pJVar5 = output_buf[2][output_row];
        pbVar7 = *input_buf;
        uVar10 = 0;
        do {
          uVar11 = (ulong)*pbVar7;
          uVar8 = (ulong)pbVar7[1];
          uVar9 = (ulong)pbVar7[2];
          pJVar3[uVar10] =
               (JSAMPLE)((uint)(*(int *)(p_Var2 + uVar8 * 8 + 0x800) + *(int *)(p_Var2 + uVar11 * 8)
                               + *(int *)(p_Var2 + uVar9 * 8 + 0x1000)) >> 0x10);
          pJVar4[uVar10] =
               (JSAMPLE)((uint)(*(int *)(p_Var2 + uVar8 * 8 + 0x2000) +
                                *(int *)(p_Var2 + uVar11 * 8 + 0x1800) +
                               *(int *)(p_Var2 + uVar9 * 8 + 0x2800)) >> 0x10);
          pJVar5[uVar10] =
               (JSAMPLE)((uint)(*(int *)(p_Var2 + uVar8 * 8 + 0x3000) +
                                *(int *)(p_Var2 + uVar11 * 8 + 0x2800) +
                               *(int *)(p_Var2 + uVar9 * 8 + 0x3800)) >> 0x10);
          uVar10 = uVar10 + 1;
          pbVar7 = pbVar7 + 3;
        } while (uVar1 != uVar10);
      }
      input_buf = input_buf + 1;
      output_row = output_row + 1;
      bVar6 = 1 < num_rows;
      num_rows = num_rows + -1;
    } while (bVar6);
  }
  return;
}

Assistant:

METHODDEF(void)
rgb_ycc_convert (j_compress_ptr cinfo,
		 JSAMPARRAY input_buf, JSAMPIMAGE output_buf,
		 JDIMENSION output_row, int num_rows)
{
  my_cconvert_ptr cconvert = (my_cconvert_ptr) cinfo->cconvert;
  register int r, g, b;
  register INT32 * ctab = cconvert->rgb_ycc_tab;
  register JSAMPROW inptr;
  register JSAMPROW outptr0, outptr1, outptr2;
  register JDIMENSION col;
  JDIMENSION num_cols = cinfo->image_width;

  while (--num_rows >= 0) {
    inptr = *input_buf++;
    outptr0 = output_buf[0][output_row];
    outptr1 = output_buf[1][output_row];
    outptr2 = output_buf[2][output_row];
    output_row++;
    for (col = 0; col < num_cols; col++) {
      r = GETJSAMPLE(inptr[RGB_RED]);
      g = GETJSAMPLE(inptr[RGB_GREEN]);
      b = GETJSAMPLE(inptr[RGB_BLUE]);
      inptr += RGB_PIXELSIZE;
      /* If the inputs are 0..MAXJSAMPLE, the outputs of these equations
       * must be too; we do not need an explicit range-limiting operation.
       * Hence the value being shifted is never negative, and we don't
       * need the general RIGHT_SHIFT macro.
       */
      /* Y */
      outptr0[col] = (JSAMPLE)
		((ctab[r+R_Y_OFF] + ctab[g+G_Y_OFF] + ctab[b+B_Y_OFF])
		 >> SCALEBITS);
      /* Cb */
      outptr1[col] = (JSAMPLE)
		((ctab[r+R_CB_OFF] + ctab[g+G_CB_OFF] + ctab[b+B_CB_OFF])
		 >> SCALEBITS);
      /* Cr */
      outptr2[col] = (JSAMPLE)
		((ctab[r+R_CR_OFF] + ctab[g+G_CR_OFF] + ctab[b+B_CR_OFF])
		 >> SCALEBITS);
    }
  }
}